

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall cmdline::parser::check(parser *this,int argc,bool ok)

{
  ostream *poVar1;
  byte in_DL;
  int in_ESI;
  allocator<char> *in_RDI;
  parser *in_stack_000001b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_ffffffffffffff48;
  bool bVar2;
  undefined1 uVar3;
  string *in_stack_ffffffffffffff58;
  parser *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [35];
  byte local_45;
  byte local_32;
  allocator<char> local_31 [36];
  byte local_d;
  
  local_d = in_DL & 1;
  local_32 = 0;
  local_45 = 0;
  if ((in_ESI != 1) || (bVar2 = true, local_d != 0)) {
    std::allocator<char>::allocator();
    local_32 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,in_RDI);
    local_45 = 1;
    bVar2 = exist(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  uVar3 = bVar2;
  if ((local_45 & 1) != 0) {
    std::__cxx11::string::~string(in_stack_ffffffffffffff20);
  }
  if ((local_32 & 1) != 0) {
    std::allocator<char>::~allocator(local_31);
  }
  if (bVar2 != false) {
    usage_abi_cxx11_(in_stack_000001b8);
    std::operator<<((ostream *)&std::cerr,local_68);
    std::__cxx11::string::~string(in_stack_ffffffffffffff20);
    exit(0);
  }
  if ((local_d & 1) != 0) {
    return;
  }
  this_00 = &local_88;
  error_abi_cxx11_((parser *)CONCAT17(uVar3,in_stack_ffffffffffffff48));
  poVar1 = std::operator<<((ostream *)&std::cerr,(string *)this_00);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  usage_abi_cxx11_(in_stack_000001b8);
  std::operator<<(poVar1,(string *)&stack0xffffffffffffff58);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::string::~string(this_00);
  exit(1);
}

Assistant:

void check(int argc, bool ok) {
    if ((argc == 1 && !ok) || exist("help")) {
      std::cerr << usage();
      exit(0);
    }

    if (!ok) {
      std::cerr << error() << std::endl << usage();
      exit(1);
    }
  }